

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int issue_char(lws *wsi,uchar c)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  allocated_headers *paVar5;
  int iVar6;
  unsigned_short frag_len;
  uchar c_local;
  lws *wsi_local;
  
  iVar6 = lws_pos_in_bounds(wsi);
  if (iVar6 == 0) {
    uVar2 = ((wsi->http).ah)->frags[((wsi->http).ah)->nfrag].len;
    if ((((wsi->http).ah)->current_token_limit == 0) ||
       ((uint)uVar2 < ((wsi->http).ah)->current_token_limit)) {
      pcVar4 = ((wsi->http).ah)->data;
      paVar5 = (wsi->http).ah;
      uVar3 = paVar5->pos;
      paVar5->pos = uVar3 + 1;
      pcVar4[uVar3] = c;
      paVar5 = (wsi->http).ah;
      bVar1 = ((wsi->http).ah)->nfrag;
      paVar5->frags[bVar1].len = paVar5->frags[bVar1].len + 1;
      wsi_local._4_4_ = 0;
    }
    else {
      if ((uint)uVar2 == ((wsi->http).ah)->current_token_limit) {
        iVar6 = lws_pos_in_bounds(wsi);
        if (iVar6 != 0) {
          return -1;
        }
        pcVar4 = ((wsi->http).ah)->data;
        paVar5 = (wsi->http).ah;
        uVar3 = paVar5->pos;
        paVar5->pos = uVar3 + 1;
        pcVar4[uVar3] = '\0';
        _lws_log(2,"header %li exceeds limit %ld\n",(ulong)((wsi->http).ah)->parser_state,
                 (ulong)((wsi->http).ah)->current_token_limit);
      }
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

static int LWS_WARN_UNUSED_RESULT
issue_char(struct lws *wsi, unsigned char c)
{
	unsigned short frag_len;

	if (lws_pos_in_bounds(wsi))
		return -1;

	frag_len = wsi->http.ah->frags[wsi->http.ah->nfrag].len;
	/*
	 * If we haven't hit the token limit, just copy the character into
	 * the header
	 */
	if (!wsi->http.ah->current_token_limit ||
	    frag_len < wsi->http.ah->current_token_limit) {
		wsi->http.ah->data[wsi->http.ah->pos++] = (char)c;
		wsi->http.ah->frags[wsi->http.ah->nfrag].len++;
		return 0;
	}

	/* Insert a null character when we *hit* the limit: */
	if (frag_len == wsi->http.ah->current_token_limit) {
		if (lws_pos_in_bounds(wsi))
			return -1;

		wsi->http.ah->data[wsi->http.ah->pos++] = '\0';
		lwsl_warn("header %li exceeds limit %ld\n",
			  (long)wsi->http.ah->parser_state,
			  (long)wsi->http.ah->current_token_limit);
	}

	return 1;
}